

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

void __thiscall
Catch::AssertionHandler::handleExpr<FIX::GapFillFlag&>
          (AssertionHandler *this,ExprLhs<FIX::GapFillFlag_&> *expr)

{
  UnaryExpr<FIX::GapFillFlag_&> UStack_28;
  
  ExprLhs<FIX::GapFillFlag_&>::makeUnaryExpr(&UStack_28,expr);
  handleExpr(this,&UStack_28.super_ITransientExpression);
  ITransientExpression::~ITransientExpression(&UStack_28.super_ITransientExpression);
  return;
}

Assistant:

void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }